

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

StatisticObject __thiscall Clasp::ClaspFacade::SolveData::BoundArray::at(BoundArray *this,uint32 i)

{
  uint32 uVar1;
  size_type sVar2;
  LevelRef *this_00;
  StatisticObject SVar3;
  uint in_ESI;
  BoundArray *in_RDI;
  LevelRef *in_stack_ffffffffffffffa8;
  uint uVar4;
  
  uVar1 = size((BoundArray *)0x12fea4);
  if (in_ESI < uVar1) {
    while (uVar4 = in_ESI,
          sVar2 = bk_lib::
                  pod_vector<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*,_std::allocator<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*>_>
                  ::size(&in_RDI->refs), sVar2 <= uVar4) {
      this_00 = (LevelRef *)operator_new(0x10);
      uVar1 = sizeVec<bk_lib::pod_vector<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef*,std::allocator<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef*>>>
                        ((pod_vector<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*,_std::allocator<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*>_>
                          *)0x12ff20);
      LevelRef::LevelRef(this_00,in_RDI,uVar1);
      bk_lib::
      pod_vector<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*,_std::allocator<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*>_>
      ::push_back((pod_vector<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*,_std::allocator<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*>_>
                   *)CONCAT44(uVar4,uVar1),(LevelRef **)this_00);
    }
    bk_lib::
    pod_vector<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*,_std::allocator<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*>_>
    ::operator[](&in_RDI->refs,in_ESI);
    SVar3 = StatisticObject::
            value<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef,_&Clasp::ClaspFacade::SolveData::BoundArray::LevelRef::value>
                      (in_stack_ffffffffffffffa8);
    return (StatisticObject)SVar3.handle_;
  }
  Potassco::fail(-2,"StatisticObject Clasp::ClaspFacade::SolveData::BoundArray::at(uint32) const",
                 0x1c1,"i < size()","invalid key",0);
}

Assistant:

StatisticObject at(uint32 i) const {
			POTASSCO_REQUIRE(i < size(), "invalid key");
			while (i >= refs.size()) { refs.push_back(new LevelRef(this, sizeVec(refs))); }
			return StatisticObject::value<LevelRef, &LevelRef::value>(refs[i]);
		}